

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadLght_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  byte *pbVar1;
  byte bVar2;
  Node *msh;
  long *plVar3;
  int *piVar4;
  pointer pcVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Light *__p;
  _Elt_pointer psVar10;
  LineSplitter *splitter_00;
  Logger *pLVar11;
  byte *pbVar12;
  range_error *this_00;
  ChunkInfo *pCVar13;
  ulong uVar14;
  LineSplitter *this_01;
  ai_real ret;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1e0 [3];
  byte *local_1c8;
  long local_1c0;
  byte local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (8 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Lght");
    return;
  }
  pCVar13 = nfo;
  __p = (Light *)operator_new(0xf0);
  COB::Node::Node((Node *)__p,TYPE_LIGHT);
  (__p->super_Node)._vptr_Node = (_func_int **)&PTR__Node_008002f0;
  *(undefined8 *)&(__p->super_Node).field_0xd4 = 0;
  *(undefined8 *)&__p->field_0xdc = 0;
  __p->inner_angle = 0.0;
  __p->ltype = SPOT;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::COB::Light*>
            (a_Stack_1e0,__p);
  local_1a8._8_8_ = a_Stack_1e0[0]._M_pi;
  a_Stack_1e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1a8._0_8_ = __p;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,(shared_ptr<Assimp::COB::Node> *)local_1a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  if (a_Stack_1e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1e0[0]._M_pi);
  }
  psVar10 = (out->nodes).
            super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar10 ==
      (out->nodes).
      super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar13 = (ChunkInfo *)
              (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar10 = (_Elt_pointer)(*(long *)&pCVar13[-1].version + 0x200);
  }
  msh = psVar10[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar8 = nfo->parent_id;
  uVar6 = nfo->version;
  uVar7 = nfo->size;
  (msh->super_ChunkInfo).id = nfo->id;
  (msh->super_ChunkInfo).parent_id = uVar8;
  (msh->super_ChunkInfo).version = uVar6;
  (msh->super_ChunkInfo).size = uVar7;
  this_01 = splitter;
  splitter_00 = LineSplitter::operator++(splitter);
  ReadBasicNodeInfo_Ascii((COBImporter *)this_01,msh,splitter_00,pCVar13);
  uVar14 = (splitter->mCur)._M_string_length;
  if (uVar14 < 9) {
    if (5 < uVar14) goto LAB_0048dcfe;
    if (uVar14 == 5) goto LAB_0048dd1b;
LAB_0048dd36:
    pLVar11 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[46]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [46])"Unknown kind of light source in `Lght` chunk ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
    pcVar5 = (splitter->mCur)._M_dataplus._M_p;
    local_1c8 = local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar5,pcVar5 + (splitter->mCur)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar11,(char *)0x0);
    if (&stack0x00000000 != (undefined1 *)0x1d8) {
      operator_delete((void *)0x0);
    }
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    plVar3 = (long *)(splitter->mCur)._M_dataplus._M_p;
    if ((char)plVar3[1] == ' ' && *plVar3 == 0x6574696e69666e49) {
      uVar8 = 2;
      goto LAB_0048de10;
    }
LAB_0048dcfe:
    piVar4 = (int *)(splitter->mCur)._M_dataplus._M_p;
    if ((short)piVar4[1] == 0x206c && *piVar4 == 0x61636f4c) {
      uVar8 = 1;
      goto LAB_0048de10;
    }
LAB_0048dd1b:
    piVar4 = (int *)(splitter->mCur)._M_dataplus._M_p;
    if ((char)piVar4[1] != ' ' || *piVar4 != 0x746f7053) goto LAB_0048dd36;
  }
  uVar8 = 0;
LAB_0048de10:
  msh[1].super_ChunkInfo.version = uVar8;
  LineSplitter::operator++(splitter);
  if (((splitter->mCur)._M_string_length < 6) ||
     (pbVar12 = (byte *)(splitter->mCur)._M_dataplus._M_p,
     *(short *)(pbVar12 + 4) != 0x2072 || *(int *)pbVar12 != 0x6f6c6f63)) {
    pLVar11 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[39]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [39])"Expected `color` line in `Lght` chunk ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar11,(char *)0x0);
    if (&stack0x00000000 != (undefined1 *)0x1d8) {
      operator_delete((void *)0x0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pbVar12 = (byte *)(splitter->mCur)._M_dataplus._M_p;
  }
  for (; (bVar2 = *pbVar12, bVar2 == 9 || (bVar2 == 0x20)); pbVar12 = pbVar12 + 1) {
  }
  do {
    uVar14 = (ulong)bVar2;
    if (bVar2 < 0x21) {
      if ((0x100000200U >> (uVar14 & 0x3f) & 1) != 0) {
        while (((char)uVar14 == ' ' || ((int)uVar14 == 9))) {
          pbVar1 = pbVar12 + 1;
          pbVar12 = pbVar12 + 1;
          uVar14 = (ulong)*pbVar1;
        }
        local_1c8 = pbVar12;
        ReadFloat3Tuple_Ascii<aiColor3D>(this,(aiColor3D *)&msh->field_0xd4,(char **)&local_1c8);
        for (pbVar12 = local_1c8; (*pbVar12 == 0x20 || (*pbVar12 == 9)); pbVar12 = pbVar12 + 1) {
        }
        local_1c8 = pbVar12;
        iVar9 = strncmp((char *)pbVar12,"cone angle",10);
        if (iVar9 != 0) {
          pLVar11 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[62]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [62])"Expected `cone angle` entity in `color` line in `Lght` chunk ")
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar11,(char *)0x0);
          if (&stack0x00000000 != (undefined1 *)0x1d8) {
            operator_delete((void *)0x0);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          pbVar12 = local_1c8;
        }
        for (local_1c8 = pbVar12 + 10; (*local_1c8 == 0x20 || (*local_1c8 == 9));
            local_1c8 = local_1c8 + 1) {
        }
        local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
        pbVar12 = (byte *)fast_atoreal_move<float>((char *)local_1c8,(float *)local_1a8,true);
        msh[1].super_ChunkInfo.id = local_1a8._0_4_;
        for (; (*pbVar12 == 0x20 || (*pbVar12 == 9)); pbVar12 = pbVar12 + 1) {
        }
        local_1c8 = pbVar12;
        iVar9 = strncmp((char *)pbVar12,"inner angle",0xb);
        if (iVar9 != 0) {
          pLVar11 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[63]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [63])"Expected `inner angle` entity in `color` line in `Lght` chunk "
                    );
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar11,(char *)0x0);
          if (&stack0x00000000 != (undefined1 *)0x1d8) {
            operator_delete((void *)0x0);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          pbVar12 = local_1c8;
        }
        for (local_1c8 = pbVar12 + 0xb; (*local_1c8 == 0x20 || (*local_1c8 == 9));
            local_1c8 = local_1c8 + 1) {
        }
        local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
        fast_atoreal_move<float>((char *)local_1c8,(float *)local_1a8,true);
        msh[1].super_ChunkInfo.parent_id = local_1a8._0_4_;
        return;
      }
      if ((0x3401UL >> (uVar14 & 0x3f) & 1) != 0) {
        this_00 = (range_error *)__cxa_allocate_exception(0x10);
        std::range_error::range_error(this_00,"Token index out of range, EOL reached");
        __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
      }
    }
    bVar2 = pbVar12[1];
    pbVar12 = pbVar12 + 1;
  } while( true );
}

Assistant:

void COBImporter::ReadLght_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Lght");
    }

    out.nodes.push_back(std::shared_ptr<Light>(new Light()));
    Light& msh = (Light&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Ascii(msh,++splitter,nfo);

    if (splitter.match_start("Infinite ")) {
        msh.ltype = Light::INFINITE;
    }
    else if (splitter.match_start("Local ")) {
        msh.ltype = Light::LOCAL;
    }
    else if (splitter.match_start("Spot ")) {
        msh.ltype = Light::SPOT;
    }
    else {
        ASSIMP_LOG_WARN_F( "Unknown kind of light source in `Lght` chunk ", nfo.id, " : ", *splitter );
        msh.ltype = Light::SPOT;
    }

    ++splitter;
    if (!splitter.match_start("color ")) {
        ASSIMP_LOG_WARN_F( "Expected `color` line in `Lght` chunk ", nfo.id );
    }

    const char* rgb = splitter[1];
    ReadFloat3Tuple_Ascii(msh.color ,&rgb);

    SkipSpaces(&rgb);
    if (strncmp(rgb,"cone angle",10) != 0) {
        ASSIMP_LOG_WARN_F( "Expected `cone angle` entity in `color` line in `Lght` chunk ", nfo.id );
    }
    SkipSpaces(rgb+10,&rgb);
    msh.angle = fast_atof(&rgb);

    SkipSpaces(&rgb);
    if (strncmp(rgb,"inner angle",11) != 0) {
        ASSIMP_LOG_WARN_F( "Expected `inner angle` entity in `color` line in `Lght` chunk ", nfo.id);
    }
    SkipSpaces(rgb+11,&rgb);
    msh.inner_angle = fast_atof(&rgb);

    // skip the rest for we can't handle this kind of physically-based lighting information.
}